

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line_to_quad<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,quad<unsigned_short> *destination,
               size_t pixel_stride,inverse *transform)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  if (pixel_stride != 0) {
    sVar3 = 0;
    do {
      uVar1 = source[pixel_stride_in + sVar3];
      uVar2 = (ushort)(source[sVar3] + uVar1) ^ 0x8000;
      destination[sVar3] =
           (quad<unsigned_short>)
           ((ulong)source[pixel_stride_in * 3 + sVar3] << 0x30 |
           (ulong)uVar2 |
           (ulong)uVar1 << 0x10 |
           (ulong)((ushort)((short)(uVar2 + uVar1 >> 1) + source[pixel_stride_in * 2 + sVar3]) ^
                  0x8000) << 0x20);
      sVar3 = sVar3 + 1;
    } while (pixel_stride != sVar3);
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}